

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall google::protobuf::internal::ExtensionSet::RemoveLast(ExtensionSet *this,int number)

{
  CppType CVar1;
  iterator iVar2;
  LogMessage *pLVar3;
  LogFinisher local_4d;
  int number_local;
  LogMessage local_48;
  
  number_local = number;
  iVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
          ::find((_Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                  *)this,&number_local);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->extensions_)._M_t._M_impl.super__Rb_tree_header) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x303);
    pLVar3 = LogMessage::operator<<(&local_48,"CHECK failed: iter != extensions_.end(): ");
    pLVar3 = LogMessage::operator<<(pLVar3,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=(&local_4d,pLVar3);
    LogMessage::~LogMessage(&local_48);
  }
  if (*(char *)((long)&iVar2._M_node[1]._M_left + 1) == '\0') {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x306);
    pLVar3 = LogMessage::operator<<(&local_48,"CHECK failed: extension->is_repeated: ");
    LogFinisher::operator=(&local_4d,pLVar3);
    LogMessage::~LogMessage(&local_48);
  }
  CVar1 = anon_unknown_29::cpp_type(*(FieldType *)&iVar2._M_node[1]._M_left);
  switch(CVar1) {
  case CPPTYPE_INT32:
  case CPPTYPE_ENUM:
    RepeatedField<int>::RemoveLast((RepeatedField<int> *)iVar2._M_node[1]._M_parent);
    break;
  case CPPTYPE_INT64:
    RepeatedField<long>::RemoveLast((RepeatedField<long> *)iVar2._M_node[1]._M_parent);
    break;
  case CPPTYPE_UINT32:
    RepeatedField<unsigned_int>::RemoveLast
              ((RepeatedField<unsigned_int> *)iVar2._M_node[1]._M_parent);
    break;
  case CPPTYPE_UINT64:
    RepeatedField<unsigned_long>::RemoveLast
              ((RepeatedField<unsigned_long> *)iVar2._M_node[1]._M_parent);
    break;
  case CPPTYPE_DOUBLE:
    RepeatedField<double>::RemoveLast((RepeatedField<double> *)iVar2._M_node[1]._M_parent);
    break;
  case CPPTYPE_FLOAT:
    RepeatedField<float>::RemoveLast((RepeatedField<float> *)iVar2._M_node[1]._M_parent);
    break;
  case CPPTYPE_BOOL:
    RepeatedField<bool>::RemoveLast((RepeatedField<bool> *)iVar2._M_node[1]._M_parent);
    break;
  case CPPTYPE_STRING:
    RepeatedPtrFieldBase::
    RemoveLast<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
              ((RepeatedPtrFieldBase *)iVar2._M_node[1]._M_parent);
    break;
  case CPPTYPE_MESSAGE:
    RepeatedPtrFieldBase::
    RemoveLast<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
              ((RepeatedPtrFieldBase *)iVar2._M_node[1]._M_parent);
  }
  return;
}

Assistant:

void ExtensionSet::RemoveLast(int number) {
  ExtensionMap::iterator iter = extensions_.find(number);
  GOOGLE_CHECK(iter != extensions_.end()) << "Index out-of-bounds (field is empty).";

  Extension* extension = &iter->second;
  GOOGLE_DCHECK(extension->is_repeated);

  switch(cpp_type(extension->type)) {
    case WireFormatLite::CPPTYPE_INT32:
      extension->repeated_int32_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_INT64:
      extension->repeated_int64_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_UINT32:
      extension->repeated_uint32_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_UINT64:
      extension->repeated_uint64_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_FLOAT:
      extension->repeated_float_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_DOUBLE:
      extension->repeated_double_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_BOOL:
      extension->repeated_bool_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_ENUM:
      extension->repeated_enum_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_STRING:
      extension->repeated_string_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_MESSAGE:
      extension->repeated_message_value->RemoveLast();
      break;
  }
}